

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolbase.h
# Opt level: O3

void __thiscall
soplex::
LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::LPColBase(LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *p_obj,
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *p_vector,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *p_upper,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *p_lower)

{
  int32_t iVar1;
  long lVar2;
  uint *puVar3;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  
  puVar3 = (uint *)p_upper;
  pLVar4 = this;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pLVar4->up).m_backend.data._M_elems[0] = *puVar3;
    puVar3 = puVar3 + 1;
    pLVar4 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)((pLVar4->up).m_backend.data._M_elems + 1);
  }
  (this->up).m_backend.exp = (p_upper->m_backend).exp;
  (this->up).m_backend.neg = (p_upper->m_backend).neg;
  iVar1 = (p_upper->m_backend).prec_elem;
  (this->up).m_backend.fpclass = (p_upper->m_backend).fpclass;
  (this->up).m_backend.prec_elem = iVar1;
  puVar3 = (uint *)p_lower;
  pnVar5 = &this->low;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = *puVar3;
    puVar3 = puVar3 + 1;
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 1);
  }
  (this->low).m_backend.exp = (p_lower->m_backend).exp;
  (this->low).m_backend.neg = (p_lower->m_backend).neg;
  iVar1 = (p_lower->m_backend).prec_elem;
  (this->low).m_backend.fpclass = (p_lower->m_backend).fpclass;
  (this->low).m_backend.prec_elem = iVar1;
  puVar3 = (uint *)p_obj;
  pnVar5 = &this->object;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = *puVar3;
    puVar3 = puVar3 + 1;
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 1);
  }
  (this->object).m_backend.exp = (p_obj->m_backend).exp;
  (this->object).m_backend.neg = (p_obj->m_backend).neg;
  iVar1 = (p_obj->m_backend).prec_elem;
  (this->object).m_backend.fpclass = (p_obj->m_backend).fpclass;
  (this->object).m_backend.prec_elem = iVar1;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->vec)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  (this->vec).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->vec,p_vector->memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->vec).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,p_vector);
  return;
}

Assistant:

LPColBase(const R& p_obj, const SVectorBase<R>& p_vector, const R& p_upper, const R& p_lower)
      : up(p_upper), low(p_lower), object(p_obj), vec(p_vector)
   {
      assert(isConsistent());
   }